

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

BaseImporter * __thiscall Assimp::Importer::GetImporter(Importer *this,char *szExtension)

{
  size_t index;
  BaseImporter *pBVar1;
  char *szExtension_local;
  Importer *this_local;
  
  index = GetImporterIndex(this,szExtension);
  pBVar1 = GetImporter(this,index);
  return pBVar1;
}

Assistant:

BaseImporter* Importer::GetImporter (const char* szExtension) const
{
    return GetImporter(GetImporterIndex(szExtension));
}